

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertMaterialForMesh
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          value_type_conflict4 materialIndex)

{
  mapped_type mVar1;
  bool bVar2;
  uint uVar3;
  vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_> *this_00;
  size_type sVar4;
  const_reference ppMVar5;
  reference ppVar6;
  mapped_type *pmVar7;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_> local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_> local_48;
  const_iterator it;
  Material *mat;
  vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_> *mats;
  value_type_conflict4 materialIndex_local;
  MeshGeometry *geo_local;
  Model *model_local;
  aiMesh *out_local;
  FBXConverter *this_local;
  
  this_00 = Model::GetMaterials(model);
  sVar4 = std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
          ::size(this_00);
  if (((uint)materialIndex < sVar4) && (-1 < materialIndex)) {
    ppMVar5 = std::
              vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
              ::operator[](this_00,(long)materialIndex);
    it._M_node = (_Base_ptr)*ppMVar5;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
         ::find(&this->materials_converted,(key_type *)&it);
    std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_48,&local_50);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
         ::end(&this->materials_converted);
    std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_58,&local_60);
    bVar2 = std::operator!=(&local_48,&local_58);
    if (bVar2) {
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>
               ::operator*(&local_48);
      out->mMaterialIndex = ppVar6->second;
    }
    else {
      uVar3 = ConvertMaterial(this,(Material *)it._M_node,geo);
      out->mMaterialIndex = uVar3;
      mVar1 = out->mMaterialIndex;
      pmVar7 = std::
               map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
               ::operator[](&this->materials_converted,(key_type *)&it);
      *pmVar7 = mVar1;
    }
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError
              ("material index out of bounds, setting default material");
    uVar3 = GetDefaultMaterial(this);
    out->mMaterialIndex = uVar3;
  }
  return;
}

Assistant:

void FBXConverter::ConvertMaterialForMesh(aiMesh* out, const Model& model, const MeshGeometry& geo,
            MatIndexArray::value_type materialIndex)
        {
            // locate source materials for this mesh
            const std::vector<const Material*>& mats = model.GetMaterials();
            if (static_cast<unsigned int>(materialIndex) >= mats.size() || materialIndex < 0) {
                FBXImporter::LogError("material index out of bounds, setting default material");
                out->mMaterialIndex = GetDefaultMaterial();
                return;
            }

            const Material* const mat = mats[materialIndex];
            MaterialMap::const_iterator it = materials_converted.find(mat);
            if (it != materials_converted.end()) {
                out->mMaterialIndex = (*it).second;
                return;
            }

            out->mMaterialIndex = ConvertMaterial(*mat, &geo);
            materials_converted[mat] = out->mMaterialIndex;
        }